

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void GetEntropyUnrefinedHelper
               (uint32_t val,int i,uint32_t *val_prev,int *i_prev,VP8LBitEntropy *bit_entropy,
               VP8LStreaks *stats)

{
  int *piVar1;
  int iVar2;
  uint32_t uVar3;
  float fVar4;
  
  iVar2 = i - *i_prev;
  if (*val_prev == 0) {
    uVar3 = 0;
  }
  else {
    bit_entropy->sum = bit_entropy->sum + *val_prev * iVar2;
    bit_entropy->nonzeros = bit_entropy->nonzeros + iVar2;
    bit_entropy->nonzero_code = *i_prev;
    uVar3 = *val_prev;
    if ((ulong)uVar3 < 0x100) {
      fVar4 = kSLog2Table[uVar3];
    }
    else {
      fVar4 = (*VP8LFastSLog2Slow)(uVar3);
      uVar3 = *val_prev;
    }
    bit_entropy->entropy = bit_entropy->entropy - (double)((float)iVar2 * fVar4);
    if (bit_entropy->max_val < uVar3) {
      bit_entropy->max_val = uVar3;
      uVar3 = *val_prev;
    }
  }
  stats->counts[uVar3 != 0] = stats->counts[uVar3 != 0] + (uint)(3 < iVar2);
  piVar1 = stats->streaks[*val_prev != 0] + (3 < iVar2);
  *piVar1 = *piVar1 + iVar2;
  *val_prev = val;
  *i_prev = i;
  return;
}

Assistant:

static WEBP_INLINE void GetEntropyUnrefinedHelper(
    uint32_t val, int i, uint32_t* const val_prev, int* const i_prev,
    VP8LBitEntropy* const bit_entropy, VP8LStreaks* const stats) {
  const int streak = i - *i_prev;

  // Gather info for the bit entropy.
  if (*val_prev != 0) {
    bit_entropy->sum += (*val_prev) * streak;
    bit_entropy->nonzeros += streak;
    bit_entropy->nonzero_code = *i_prev;
    bit_entropy->entropy -= VP8LFastSLog2(*val_prev) * streak;
    if (bit_entropy->max_val < *val_prev) {
      bit_entropy->max_val = *val_prev;
    }
  }

  // Gather info for the Huffman cost.
  stats->counts[*val_prev != 0] += (streak > 3);
  stats->streaks[*val_prev != 0][(streak > 3)] += streak;

  *val_prev = val;
  *i_prev = i;
}